

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O2

string * __thiscall
Kraken::KClient::public_method
          (string *__return_storage_ptr__,KClient *this,string *method,KInput *input)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  runtime_error *this_00;
  string method_url;
  string postdata;
  string path;
  string local_1c8 [32];
  ostringstream oss;
  
  std::operator+(&method_url,"/",&this->version_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                 &method_url,"/public/");
  std::operator+(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                 method);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&method_url);
  std::operator+(&method_url,&this->url_,&path);
  curl_easy_setopt(this->curl_,0x2712,method_url._M_dataplus._M_p);
  build_query(&postdata,input);
  curl_easy_setopt(this->curl_,0x271f,postdata._M_dataplus._M_p);
  curl_easy_setopt(this->curl_,0x2727,0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  curl_easy_setopt(this->curl_,0x2711,__return_storage_ptr__);
  iVar1 = curl_easy_perform(this->curl_);
  if (iVar1 == 0) {
    std::__cxx11::string::~string((string *)&postdata);
    std::__cxx11::string::~string((string *)&method_url);
    std::__cxx11::string::~string((string *)&path);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"curl_easy_perform() failed: ");
  pcVar3 = (char *)curl_easy_strerror(iVar1);
  std::operator<<(poVar2,pcVar3);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string KClient::public_method(const std::string& method, 
				const KInput& input) const
{
   // build method URL
   std::string path = "/" + version_ + "/public/" + method;
   std::string method_url = url_ + path;   
   curl_easy_setopt(curl_, CURLOPT_URL, method_url.c_str());

   // build postdata 
   std::string postdata = build_query(input);
   curl_easy_setopt(curl_, CURLOPT_POSTFIELDS, postdata.c_str());

   // reset the http header
   curl_easy_setopt(curl_, CURLOPT_HTTPHEADER, NULL);

   // where CURL write callback function stores the response
   std::string response;
   curl_easy_setopt(curl_, CURLOPT_WRITEDATA, static_cast<void*>(&response));
 
   // perform CURL request
   CURLcode result = curl_easy_perform(curl_);
   if (result != CURLE_OK) {
      std::ostringstream oss;  
      oss << "curl_easy_perform() failed: "<< curl_easy_strerror(result);
      throw std::runtime_error(oss.str());
   }

   return response;
}